

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O1

void duckdb::BitwiseOROperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  VectorType VVar3;
  VectorType VVar4;
  unsigned_long *puVar5;
  long lVar6;
  data_ptr_t pdVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar8;
  byte bVar9;
  anon_struct_16_3_d7536bce_for_pointer aVar10;
  ValidityMask *pVVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Vector *this_00;
  reference vector;
  reference vector_00;
  idx_t iVar14;
  ulong uVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  idx_t iVar17;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  idx_t extraout_RDX_03;
  idx_t extraout_RDX_04;
  idx_t iVar18;
  idx_t extraout_RDX_05;
  idx_t extraout_RDX_06;
  idx_t extraout_RDX_07;
  idx_t extraout_RDX_08;
  idx_t extraout_RDX_09;
  ulong uVar19;
  data_ptr_t pdVar20;
  idx_t idx_in_entry;
  unsigned_long uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  string_t target_7;
  string_t target;
  undefined1 local_148 [24];
  Vector *local_130;
  data_ptr_t local_128;
  idx_t local_120;
  data_ptr_t local_118;
  anon_struct_16_3_d7536bce_for_pointer *local_110;
  ulong *local_108;
  Vector *local_100;
  char *local_f8;
  anon_union_16_2_67f50693_for_value local_f0;
  long local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  anon_union_16_2_67f50693_for_value local_a8;
  long local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  anon_union_16_2_67f50693_for_value local_60;
  ulong local_50;
  ulong local_48;
  anon_union_16_2_67f50693_for_value local_40;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar3 = vector->vector_type;
  VVar4 = vector_00->vector_type;
  local_130 = result;
  if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar20 = result->data;
    result = local_130;
    if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
       ((puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar5 == (unsigned_long *)0x0 || ((*puVar5 & 1) != 0)))) {
      local_a8._0_8_ = *(undefined8 *)vector->data;
      local_a8.pointer.ptr = (char *)*(ulong *)((long)vector->data + 8);
      local_148._0_16_ = *(undefined1 (*) [16])vector_00->data;
      local_f0.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString
                     ((StringVector *)local_130,(Vector *)(local_a8._0_8_ & 0xffffffff),
                      local_a8._0_8_);
      Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                     (bitstring_t *)&local_f0.pointer);
      *(undefined8 *)pdVar20 = local_f0._0_8_;
      *(char **)(pdVar20 + 8) = local_f0.pointer.ptr;
      return;
    }
  }
  else {
    iVar18 = args->count;
    local_120 = iVar18;
    if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
      pdVar20 = vector->data;
      local_110 = (anon_struct_16_3_d7536bce_for_pointer *)vector_00->data;
      puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        local_128 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar18 == 0) {
            return;
          }
          aVar10 = *local_110;
          lVar24 = 8;
          iVar18 = extraout_RDX;
          do {
            local_a8._0_8_ = *(undefined8 *)(pdVar20 + lVar24 + -8);
            local_a8.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + lVar24);
            local_148._0_16_ = (undefined1  [16])aVar10;
            local_f0.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString
                           ((StringVector *)local_130,(Vector *)(local_a8._0_8_ & 0xffffffff),iVar18
                           );
            Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                           (bitstring_t *)&local_f0.pointer);
            *(undefined8 *)(local_128 + lVar24 + -8) = local_f0._0_8_;
            *(char **)(local_128 + lVar24 + -8 + 8) = local_f0.pointer.ptr;
            lVar24 = lVar24 + 0x10;
            local_120 = local_120 - 1;
            iVar18 = extraout_RDX_05;
          } while (local_120 != 0);
          return;
        }
        if (iVar18 + 0x3f < 0x40) {
          return;
        }
        local_108 = (ulong *)(iVar18 + 0x3f >> 6);
        local_100 = (Vector *)0x0;
        iVar18 = extraout_RDX;
        uVar19 = 0;
        do {
          puVar5 = (local_130->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar21 = 0xffffffffffffffff;
          }
          else {
            uVar21 = puVar5[(long)local_100];
          }
          uVar15 = uVar19 + 0x40;
          if (local_120 <= uVar19 + 0x40) {
            uVar15 = local_120;
          }
          uVar23 = uVar15;
          if (uVar21 != 0) {
            uVar23 = uVar19;
            if (uVar21 == 0xffffffffffffffff) {
              if (uVar19 < uVar15) {
                local_118._0_4_ = local_110->length;
                local_118._4_1_ = local_110->prefix[0];
                local_118._5_1_ = local_110->prefix[1];
                local_118._6_1_ = local_110->prefix[2];
                local_118._7_1_ = local_110->prefix[3];
                local_f8 = local_110->ptr;
                uVar22 = uVar19 << 4 | 8;
                do {
                  local_a8._0_8_ = *(undefined8 *)(pdVar20 + (uVar22 - 8));
                  local_a8.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + uVar22);
                  local_148._8_8_ = local_f8;
                  local_148._0_8_ = local_118;
                  local_f0.pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)
                       StringVector::EmptyString
                                 ((StringVector *)local_130,(Vector *)(local_a8._0_8_ & 0xffffffff),
                                  iVar18);
                  Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                                 (bitstring_t *)&local_f0.pointer);
                  *(undefined8 *)(local_128 + (uVar22 - 8)) = local_f0._0_8_;
                  *(char **)(local_128 + (uVar22 - 8) + 8) = local_f0.pointer.ptr;
                  uVar19 = uVar19 + 1;
                  uVar22 = uVar22 + 0x10;
                  iVar18 = extraout_RDX_00;
                  uVar23 = uVar19;
                } while (uVar15 != uVar19);
              }
            }
            else if (uVar19 < uVar15) {
              uVar22 = uVar19 << 4 | 8;
              uVar23 = 0;
              do {
                if ((uVar21 >> (uVar23 & 0x3f) & 1) != 0) {
                  local_a8._0_8_ = *(undefined8 *)(pdVar20 + (uVar22 - 8));
                  local_a8.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + uVar22);
                  local_148._0_16_ = *(undefined1 (*) [16])local_110;
                  local_f0.pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)
                       StringVector::EmptyString
                                 ((StringVector *)local_130,(Vector *)(local_a8._0_8_ & 0xffffffff),
                                  (idx_t)local_110);
                  Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                                 (bitstring_t *)&local_f0.pointer);
                  *(undefined8 *)(local_128 + (uVar22 - 8)) = local_f0._0_8_;
                  *(char **)(local_128 + (uVar22 - 8) + 8) = local_f0.pointer.ptr;
                  iVar18 = extraout_RDX_01;
                }
                uVar23 = uVar23 + 1;
                uVar22 = uVar22 + 0x10;
              } while ((uVar19 - uVar15) + uVar23 != 0);
              uVar23 = uVar19 + uVar23;
            }
          }
          local_100 = (Vector *)((long)local_100 + 1);
          uVar19 = uVar23;
        } while (local_100 != (Vector *)local_108);
        return;
      }
    }
    else {
      if ((VVar3 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
        if (VVar4 == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
          pdVar20 = vector->data;
          local_118 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar7 = result->data;
          FlatVector::VerifyFlatVector(result);
          local_110 = (anon_struct_16_3_d7536bce_for_pointer *)&result->validity;
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine((ValidityMask *)local_110,&vector_00->validity,iVar18);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar18 != 0) {
              lVar24 = 8;
              do {
                local_a8._0_8_ = *(undefined8 *)(pdVar20 + lVar24 + -8);
                local_a8.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + lVar24);
                local_148._0_16_ = *(undefined1 (*) [16])(local_118 + lVar24 + -8);
                local_f0.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     StringVector::EmptyString
                               ((StringVector *)local_130,(Vector *)(local_a8._0_8_ & 0xffffffff),
                                (idx_t)local_118);
                Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                               (bitstring_t *)&local_f0.pointer);
                pdVar2 = pdVar7 + lVar24 + -8;
                *(undefined8 *)pdVar2 = local_f0._0_8_;
                *(char **)(pdVar2 + 8) = local_f0.pointer.ptr;
                lVar24 = lVar24 + 0x10;
                local_120 = local_120 - 1;
              } while (local_120 != 0);
            }
          }
          else if (0x3f < iVar18 + 0x3f) {
            local_100 = (Vector *)(iVar18 + 0x3f >> 6);
            local_f8 = (char *)0x0;
            iVar18 = extraout_RDX_06;
            uVar19 = 0;
            local_128 = pdVar7;
            do {
              pdVar7 = local_118;
              this_00 = local_130;
              puVar5 = ((TemplatedValidityMask<unsigned_long> *)&local_110->length)->validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                uVar21 = 0xffffffffffffffff;
              }
              else {
                uVar21 = puVar5[(long)local_f8];
              }
              uVar15 = uVar19 + 0x40;
              if (local_120 <= uVar19 + 0x40) {
                uVar15 = local_120;
              }
              uVar23 = uVar15;
              if (uVar21 != 0) {
                uVar23 = uVar19;
                if (uVar21 == 0xffffffffffffffff) {
                  if (uVar19 < uVar15) {
                    uVar19 = uVar19 << 4 | 8;
                    do {
                      local_a8._0_8_ = *(undefined8 *)(pdVar20 + (uVar19 - 8));
                      local_a8.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + uVar19);
                      local_148._0_16_ = *(undefined1 (*) [16])(pdVar7 + (uVar19 - 8));
                      local_f0.pointer =
                           (anon_struct_16_3_d7536bce_for_pointer)
                           StringVector::EmptyString
                                     ((StringVector *)this_00,
                                      (Vector *)(local_a8._0_8_ & 0xffffffff),iVar18);
                      Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                                     (bitstring_t *)&local_f0.pointer);
                      *(undefined8 *)(local_128 + (uVar19 - 8)) = local_f0._0_8_;
                      *(char **)(local_128 + (uVar19 - 8) + 8) = local_f0.pointer.ptr;
                      uVar23 = uVar23 + 1;
                      uVar19 = uVar19 + 0x10;
                      iVar18 = extraout_RDX_07;
                    } while (uVar15 != uVar23);
                  }
                }
                else if (uVar19 < uVar15) {
                  uVar23 = uVar19 << 4 | 8;
                  uVar22 = 0;
                  do {
                    if ((uVar21 >> (uVar22 & 0x3f) & 1) != 0) {
                      local_a8._0_8_ = *(undefined8 *)(pdVar20 + (uVar23 - 8));
                      local_a8.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + uVar23);
                      local_148._0_16_ = *(undefined1 (*) [16])(local_118 + (uVar23 - 8));
                      local_f0.pointer =
                           (anon_struct_16_3_d7536bce_for_pointer)
                           StringVector::EmptyString
                                     ((StringVector *)local_130,
                                      (Vector *)(local_a8._0_8_ & 0xffffffff),(idx_t)local_118);
                      Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                                     (bitstring_t *)&local_f0.pointer);
                      *(undefined8 *)(local_128 + (uVar23 - 8)) = local_f0._0_8_;
                      *(char **)(local_128 + (uVar23 - 8) + 8) = local_f0.pointer.ptr;
                      iVar18 = extraout_RDX_08;
                    }
                    uVar22 = uVar22 + 1;
                    uVar23 = uVar23 + 0x10;
                  } while ((uVar19 - uVar15) + uVar22 != 0);
                  uVar23 = uVar19 + uVar22;
                }
              }
              local_f8 = (char *)((long)local_f8 + 1);
              uVar19 = uVar23;
            } while ((Vector *)local_f8 != local_100);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_f0.pointer);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_a8.pointer);
          Vector::ToUnifiedFormat(vector,iVar18,(UnifiedVectorFormat *)&local_f0.pointer);
          Vector::ToUnifiedFormat(vector_00,iVar18,(UnifiedVectorFormat *)&local_a8.pointer);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar20 = result->data;
          local_128 = (data_ptr_t)local_a8.pointer.ptr;
          FlatVector::VerifyFlatVector(result);
          if (local_98 == 0 && local_e0 == 0) {
            if (iVar18 != 0) {
              lVar24 = *(long *)local_f0._0_8_;
              lVar6 = *(long *)local_a8._0_8_;
              pdVar20 = pdVar20 + 8;
              iVar18 = 0;
              do {
                iVar14 = iVar18;
                if (lVar24 != 0) {
                  iVar14 = (idx_t)*(uint *)(lVar24 + iVar18 * 4);
                }
                iVar17 = iVar18;
                if (lVar6 != 0) {
                  iVar17 = (idx_t)*(uint *)(lVar6 + iVar18 * 4);
                }
                local_60._0_8_ = *(undefined8 *)(local_f0.pointer.ptr + iVar14 * 0x10);
                local_60.pointer.ptr =
                     (char *)*(undefined8 *)(local_f0.pointer.ptr + iVar14 * 0x10 + 8);
                local_40._0_8_ = *(undefined8 *)(local_128 + iVar17 * 0x10);
                local_40.pointer.ptr = (char *)*(undefined8 *)(local_128 + iVar17 * 0x10 + 8);
                local_148._0_16_ =
                     (undefined1  [16])
                     StringVector::EmptyString
                               ((StringVector *)local_130,(Vector *)(local_60._0_8_ & 0xffffffff),
                                local_60._0_8_);
                Bit::BitwiseOr((bitstring_t *)&local_60.pointer,(bitstring_t *)&local_40.pointer,
                               (bitstring_t *)local_148);
                *(undefined8 *)(pdVar20 + -8) = local_148._0_8_;
                *(undefined8 *)pdVar20 = local_148._8_8_;
                iVar18 = iVar18 + 1;
                pdVar20 = pdVar20 + 0x10;
              } while (local_120 != iVar18);
            }
          }
          else if (iVar18 != 0) {
            lVar24 = *(long *)local_f0._0_8_;
            lVar6 = *(long *)local_a8._0_8_;
            pVVar11 = &local_130->validity;
            pdVar20 = pdVar20 + 8;
            uVar19 = 0;
            do {
              uVar15 = uVar19;
              if (lVar24 != 0) {
                uVar15 = (ulong)*(uint *)(lVar24 + uVar19 * 4);
              }
              uVar23 = uVar19;
              if (lVar6 != 0) {
                uVar23 = (ulong)*(uint *)(lVar6 + uVar19 * 4);
              }
              if (((local_e0 == 0) ||
                  ((*(ulong *)(local_e0 + (uVar15 >> 6) * 8) >> (uVar15 & 0x3f) & 1) != 0)) &&
                 ((local_98 == 0 ||
                  ((*(ulong *)(local_98 + (uVar23 >> 6) * 8) >> (uVar23 & 0x3f) & 1) != 0)))) {
                local_60._0_8_ = *(undefined8 *)(local_f0.pointer.ptr + uVar15 * 0x10);
                local_60.pointer.ptr =
                     (char *)*(undefined8 *)(local_f0.pointer.ptr + uVar15 * 0x10 + 8);
                local_40._0_8_ = *(undefined8 *)(local_128 + uVar23 * 0x10);
                local_40.pointer.ptr = (char *)*(undefined8 *)(local_128 + uVar23 * 0x10 + 8);
                local_148._0_16_ =
                     (undefined1  [16])
                     StringVector::EmptyString
                               ((StringVector *)local_130,(Vector *)(local_60._0_8_ & 0xffffffff),
                                local_60._0_8_);
                Bit::BitwiseOr((bitstring_t *)&local_60.pointer,(bitstring_t *)&local_40.pointer,
                               (bitstring_t *)local_148);
                *(undefined8 *)(pdVar20 + -8) = local_148._0_8_;
                *(undefined8 *)pdVar20 = local_148._8_8_;
              }
              else {
                if ((local_130->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                    == (unsigned_long *)0x0) {
                  local_60._0_8_ =
                       (local_130->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_148,(unsigned_long *)&local_60);
                  uVar12 = local_148._0_8_;
                  uVar13 = local_148._8_8_;
                  local_148._0_16_ = ZEXT816(0);
                  this = (local_130->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (local_130->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)uVar12;
                  (local_130->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
                  }
                  pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(pVVar11->super_TemplatedValidityMask<unsigned_long>).
                                        validity_data);
                  (local_130->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar16->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)uVar19 & 0x3f;
                puVar1 = (local_130->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + (uVar19 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              uVar19 = uVar19 + 1;
              pdVar20 = pdVar20 + 0x10;
            } while (local_120 != uVar19);
          }
          if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
          }
          if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
          }
          if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
          }
          if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
          }
        }
        return;
      }
      local_108 = (ulong *)vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      local_118 = vector_00->data;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        local_128 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar18 == 0) {
            return;
          }
          uVar19 = *local_108;
          pcVar8 = (char *)local_108[1];
          lVar24 = 8;
          iVar18 = extraout_RDX_02;
          do {
            local_148._0_16_ = *(undefined1 (*) [16])(local_118 + lVar24 + -8);
            local_a8._0_8_ = uVar19;
            local_a8.pointer.ptr = pcVar8;
            local_f0.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString
                           ((StringVector *)local_130,(Vector *)(uVar19 & 0xffffffff),iVar18);
            Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                           (bitstring_t *)&local_f0.pointer);
            *(undefined8 *)(local_128 + lVar24 + -8) = local_f0._0_8_;
            *(char **)(local_128 + lVar24 + -8 + 8) = local_f0.pointer.ptr;
            lVar24 = lVar24 + 0x10;
            local_120 = local_120 - 1;
            iVar18 = extraout_RDX_09;
          } while (local_120 != 0);
          return;
        }
        if (iVar18 + 0x3f < 0x40) {
          return;
        }
        local_50 = iVar18 + 0x3f >> 6;
        iVar18 = 0;
        uVar19 = 0;
        do {
          pdVar20 = local_118;
          puVar5 = (local_130->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar21 = 0xffffffffffffffff;
          }
          else {
            uVar21 = puVar5[iVar18];
          }
          uVar15 = uVar19 + 0x40;
          if (local_120 <= uVar19 + 0x40) {
            uVar15 = local_120;
          }
          uVar23 = uVar15;
          local_48 = iVar18;
          if (uVar21 != 0) {
            uVar23 = uVar19;
            if (uVar21 == 0xffffffffffffffff) {
              if (uVar19 < uVar15) {
                local_f8 = (char *)*local_108;
                local_110 = (anon_struct_16_3_d7536bce_for_pointer *)local_108[1];
                uVar22 = uVar19 << 4 | 8;
                local_100 = (Vector *)((ulong)local_f8 & 0xffffffff);
                do {
                  local_148._0_16_ = *(undefined1 (*) [16])(local_118 + (uVar22 - 8));
                  local_a8._0_8_ = local_f8;
                  local_a8.pointer.ptr = (char *)local_110;
                  local_f0.pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)
                       StringVector::EmptyString((StringVector *)local_130,local_100,iVar18);
                  Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                                 (bitstring_t *)&local_f0.pointer);
                  *(undefined8 *)(local_128 + (uVar22 - 8)) = local_f0._0_8_;
                  *(char **)(local_128 + (uVar22 - 8) + 8) = local_f0.pointer.ptr;
                  uVar19 = uVar19 + 1;
                  uVar22 = uVar22 + 0x10;
                  iVar18 = extraout_RDX_03;
                  uVar23 = uVar19;
                } while (uVar15 != uVar19);
              }
            }
            else if (uVar19 < uVar15) {
              uVar22 = uVar19 << 4 | 8;
              uVar23 = 0;
              do {
                if ((uVar21 >> (uVar23 & 0x3f) & 1) != 0) {
                  local_a8._0_8_ = *local_108;
                  local_a8.pointer.ptr = (char *)local_108[1];
                  local_148._0_16_ = *(undefined1 (*) [16])(pdVar20 + (uVar22 - 8));
                  local_f0.pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)
                       StringVector::EmptyString
                                 ((StringVector *)local_130,(Vector *)(local_a8._0_8_ & 0xffffffff),
                                  iVar18);
                  Bit::BitwiseOr((bitstring_t *)&local_a8.pointer,(bitstring_t *)local_148,
                                 (bitstring_t *)&local_f0.pointer);
                  *(undefined8 *)(local_128 + (uVar22 - 8)) = local_f0._0_8_;
                  *(char **)(local_128 + (uVar22 - 8) + 8) = local_f0.pointer.ptr;
                  iVar18 = extraout_RDX_04;
                }
                uVar23 = uVar23 + 1;
                uVar22 = uVar22 + 0x10;
              } while ((uVar19 - uVar15) + uVar23 != 0);
              uVar23 = uVar19 + uVar23;
            }
          }
          iVar18 = local_48 + 1;
          uVar19 = uVar23;
        } while (iVar18 != local_50);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitwiseOROperation(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t rhs, string_t lhs) {
		    string_t target = StringVector::EmptyString(result, rhs.GetSize());

		    Bit::BitwiseOr(rhs, lhs, target);
		    return target;
	    });
}